

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O2

double r8_psi(double xx)

{
  long lVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_58 [8];
  double local_18;
  undefined8 uStack_10;
  
  local_58[0] = 44.992760373789366;
  local_58[1] = 202.40955312679932;
  local_58[2] = 247.3697900331529;
  local_58[3] = 107.42543875702279;
  local_58[4] = 17.46396506067857;
  local_58[5] = 0.8842752039887348;
  if ((xx <= -3.6e+16) || (dVar4 = ABS(xx), dVar4 < 5.89e-39)) {
LAB_001c696e:
    dVar4 = *(double *)(&DAT_0021f680 + (ulong)(0.0 < xx) * 8);
  }
  else {
    local_18 = 0.0;
    uStack_10 = 0;
    if (xx < 0.5) {
      if (dVar4 <= 2.05e-09) {
        uStack_10 = 0;
        local_18 = -1.0 / xx;
      }
      else {
        dVar3 = (dVar4 - (double)(int)dVar4) * 4.0;
        iVar2 = (int)dVar3;
        dVar4 = ((double)(int)dVar3 * -0.25 + (dVar4 - (double)(int)dVar4)) * 4.0;
        if ((int)((long)iVar2 / 2) * 2 != iVar2) {
          dVar4 = 1.0 - dVar4;
        }
        local_18 = *(double *)(&DAT_0021f670 + (ulong)(xx < 0.0) * 8);
        uStack_10 = 0;
        if (((long)iVar2 / 2 & 1U) != 0) {
          uStack_10 = 0x8000000000000000;
          local_18 = -local_18;
        }
        dVar4 = dVar4 * 0.7853981633974483;
        local_58[6] = xx;
        if (((long)(iVar2 + 1) / 2 & 1U) == 0) {
          if ((dVar4 == 0.0) && (!NAN(dVar4))) goto LAB_001c696e;
          dVar4 = tan(dVar4);
          local_18 = local_18 * (4.0 / dVar4);
          xx = local_58[6];
        }
        else {
          dVar4 = tan(dVar4);
          local_18 = local_18 * dVar4 * 4.0;
          xx = local_58[6];
        }
      }
      xx = 1.0 - xx;
    }
    if (xx <= 3.0) {
      dVar3 = 0.004510468124576294;
      dVar4 = xx;
      for (lVar1 = 0; lVar1 != 0x38; lVar1 = lVar1 + 8) {
        dVar4 = (dVar4 + *(double *)((long)&DAT_0021f9e0 + lVar1)) * xx;
        dVar3 = dVar3 * xx + *(double *)((long)&DAT_0021f958 + lVar1);
      }
      dVar4 = (xx + -1.4609375 + -0.0006946449683623413) *
              ((dVar3 * xx + 165856.95029761022) / (dVar4 + 6.415522378357623e-08)) + local_18;
    }
    else {
      if (xx < 2.04e+15) {
        dVar5 = 1.0 / (xx * xx);
        dVar3 = -2.7103228277757836;
        dVar4 = dVar5;
        for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
          dVar4 = (dVar4 + local_58[lVar1]) * dVar5;
          dVar3 = dVar3 * dVar5 + (double)(&DAT_0021f9a8)[lVar1];
        }
        local_18 = local_18 +
                   -0.5 / xx +
                   (dVar3 * dVar5 + -6.513538773271817e-21) / (dVar4 + 0.8842752039887348);
      }
      dVar4 = log(xx);
      dVar4 = dVar4 + local_18;
    }
  }
  return dVar4;
}

Assistant:

double r8_psi ( double xx )

//****************************************************************************80
//
//  Purpose:
//
//    R8_PSI evaluates the function Psi(X).
//
//  Discussion:
//
//    This routine evaluates the logarithmic derivative of the
//    Gamma function,
//
//      PSI(X) = d/dX ( GAMMA(X) ) / GAMMA(X)
//             = d/dX LN ( GAMMA(X) )
//
//    for real X, where either
//
//      - XMAX1 < X < - XMIN, and X is not a negative integer,
//
//    or
//
//      XMIN < X.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    09 February 2008
//
//  Author:
//
//    Original FORTRAN77 version by William Cody.
//    C++ version by John Burkardt.
//
//  Reference:
//
//    William Cody, Anthony Strecok, Henry Thacher,
//    Chebyshev Approximations for the Psi Function,
//    Mathematics of Computation,
//    Volume 27, Number 121, January 1973, pages 123-127.
//
//  Parameters:
//
//    Input, double XX, the argument of the function.
//
//    Output, double R8_PSI, the value of the function.
//
{
  double aug;
  double den;
  double four = 4.0;
  double fourth = 0.25;
  double half = 0.5;
  int i;
  int n;
  int nq;
  double one = 1.0;
  double p1[9] = { 
   4.5104681245762934160E-03, 
   5.4932855833000385356, 
   3.7646693175929276856E+02, 
   7.9525490849151998065E+03, 
   7.1451595818951933210E+04, 
   3.0655976301987365674E+05, 
   6.3606997788964458797E+05, 
   5.8041312783537569993E+05, 
   1.6585695029761022321E+05 };
  double p2[7] = { 
  -2.7103228277757834192, 
  -1.5166271776896121383E+01, 
  -1.9784554148719218667E+01, 
  -8.8100958828312219821, 
  -1.4479614616899842986, 
  -7.3689600332394549911E-02, 
  -6.5135387732718171306E-21 };
  double piov4 = 0.78539816339744830962;
  double q1[8] = { 
   9.6141654774222358525E+01, 
   2.6287715790581193330E+03, 
   2.9862497022250277920E+04, 
   1.6206566091533671639E+05, 
   4.3487880712768329037E+05, 
   5.4256384537269993733E+05, 
   2.4242185002017985252E+05, 
   6.4155223783576225996E-08 };
  double q2[6] = { 
   4.4992760373789365846E+01, 
   2.0240955312679931159E+02, 
   2.4736979003315290057E+02, 
   1.0742543875702278326E+02, 
   1.7463965060678569906E+01, 
   8.8427520398873480342E-01 };
  double sgn;
  double three = 3.0;
  double upper;
  double value;
  double w;
  double x;
  double x01 = 187.0;
  double x01d = 128.0;
  double x02 = 6.9464496836234126266E-04;
  double xinf = 1.70E+38;
  double xlarge = 2.04E+15;
  double xmax1 = 3.60E+16;
  double xmin1 = 5.89E-39;
  double xsmall = 2.05E-09;
  double z;
  double zero = 0.0;

  x = xx;
  w = fabs ( x );
  aug = zero;
//
//  Check for valid arguments, then branch to appropriate algorithm.
//
  if ( xmax1 <= - x || w < xmin1 )
  {
    if ( zero < x )
    {
      value = - xinf;
    }
    else
    {
      value = xinf;
    }
    return value;
  }

  if ( x < half )
  {
//
//  X < 0.5, use reflection formula: psi(1-x) = psi(x) + pi * cot(pi*x)
//  Use 1/X for PI*COTAN(PI*X)  when  XMIN1 < |X| <= XSMALL.
//
    if ( w <= xsmall )
    {
      aug = - one / x;
    }
//
//  Argument reduction for cotangent.
//
    else
    {
      if ( x < zero )
      {
        sgn = piov4;
      }
      else
      {
        sgn = - piov4;
      }

      w = w - double( int( w ) );
      nq = int ( w * four );
      w = four * ( w - double( nq ) * fourth );
//
//  W is now related to the fractional part of 4.0 * X.
//  Adjust argument to correspond to values in the first
//  quadrant and determine the sign.
//
      n = nq / 2;

      if ( n + n != nq )
      {
        w = one - w;
      }

      z = piov4 * w;

      if ( ( n % 2 ) != 0 )
      {
        sgn = - sgn;
      }
//
//  Determine the final value for  -pi * cotan(pi*x).
//
      n = ( nq + 1 ) / 2;
      if ( ( n % 2 ) == 0 )
      {
//
//  Check for singularity.
//
        if ( z == zero )
        {
          if ( zero < x )
          {
            value = -xinf;
          }
          else
          {
            value = xinf;
          }
          return value;
        }
        aug = sgn * ( four / tan ( z ) );
      }
      else
      {
        aug = sgn * ( four * tan ( z ) );
      }
    }
    x = one - x;
  }
//
//  0.5 <= X <= 3.0.
//
  if ( x <= three )
  {
    den = x;
    upper = p1[0] * x;
    for ( i = 1; i <= 7; i++ )
    {
      den = ( den + q1[i-1] ) * x;
      upper = ( upper + p1[i]) * x;
    }
    den = ( upper + p1[8] ) / ( den + q1[7] );
    x = ( x - x01 / x01d ) - x02;
    value = den * x + aug;
    return value;
  }
//
//  3.0 < X.
//
  if ( x < xlarge )
  {
    w = one / ( x * x );
    den = w;
    upper = p2[0] * w;
    for ( i = 1; i <= 5; i++ )
    {
      den = ( den + q2[i-1] ) * w;
      upper = ( upper + p2[i] ) * w;
    }
    aug = ( upper + p2[6] ) / ( den + q2[5] ) - half / x + aug;
  }

  value = aug + log ( x );

  return value;
}